

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_collective.cpp
# Opt level: O2

void __thiscall MxxColl_GathervGeneral_Test::TestBody(MxxColl_GathervGeneral_Test *this)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  size_t i;
  size_type sVar5;
  ulong uVar6;
  size_type __n;
  long lVar7;
  int iVar8;
  long lVar9;
  char *pcVar10;
  long lVar11;
  int iVar12;
  AssertHelper local_100;
  _Vector_base<int,_std::allocator<int>_> local_f8;
  AssertionResult gtest_ar;
  vector<int,_std::allocator<int>_> all;
  size_t total_size;
  comm c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_sizes;
  vector<int,_std::allocator<int>_> els;
  
  mxx::comm::comm(&c);
  recv_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  recv_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  recv_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __n = (size_type)(c.m_rank * 5 + 10);
  std::vector<int,_std::allocator<int>_>::vector(&els,__n,(allocator_type *)&gtest_ar);
  iVar1 = 0;
  for (sVar5 = 0; __n != sVar5; sVar5 = sVar5 + 1) {
    els.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [sVar5] = c.m_rank * 0xd + iVar1;
    iVar1 = iVar1 + -0x2a;
  }
  all.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  all.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  all.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  total_size = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&recv_sizes,(long)c.m_size);
  uVar6 = 0;
  uVar3 = (ulong)(uint)c.m_size;
  if (c.m_size < 1) {
    uVar3 = uVar6;
  }
  lVar9 = 0xa00000000;
  for (; uVar3 != uVar6; uVar6 = uVar6 + 1) {
    recv_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[uVar6] = lVar9 >> 0x20;
    total_size = total_size + (lVar9 >> 0x20);
    lVar9 = lVar9 + 0x500000000;
  }
  std::vector<int,_std::allocator<int>_>::resize(&all,total_size);
  mxx::gatherv<int>(els.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,__n,
                    all.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,&recv_sizes,0,&c);
  if (c.m_rank == 0) {
    iVar1 = 10;
    iVar2 = 0;
    lVar9 = 0;
    iVar4 = 0;
    while( true ) {
      iVar8 = 0;
      if (0 < iVar1) {
        iVar8 = iVar1;
      }
      if (c.m_size <= iVar4) break;
      lVar7 = lVar9 * 4;
      iVar12 = iVar2;
      for (lVar11 = 0; -iVar8 != (int)lVar11; lVar11 = lVar11 + -1) {
        local_f8._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_f8._M_impl.super__Vector_impl_data._M_start._4_4_,iVar12);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar,"i*13 - 42*j","all[pos++]",(int *)&local_f8,
                   (int *)((long)all.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar7));
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_f8);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar10 = "";
          }
          else {
            pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_100,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_collective.cpp"
                     ,0x14d,pcVar10);
          testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
          goto LAB_0014deb5;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        lVar7 = lVar7 + 4;
        iVar12 = iVar12 + -0x2a;
      }
      iVar4 = iVar4 + 1;
      iVar1 = iVar1 + 5;
      lVar9 = lVar9 - lVar11;
      iVar2 = iVar2 + 0xd;
    }
  }
  mxx::gatherv<int>((vector<int,_std::allocator<int>_> *)&gtest_ar,
                    els.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,__n,&recv_sizes,0,&c);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&all,&gtest_ar);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&gtest_ar);
  if (c.m_rank == 0) {
    local_f8._M_impl.super__Vector_impl_data._M_start =
         (pointer)((long)all.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)all.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar,"total_size","all.size()",&total_size,
               (unsigned_long *)&local_f8);
    if (gtest_ar.success_ != false) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      iVar1 = 10;
      iVar2 = 0;
      lVar9 = 0;
      iVar4 = 0;
      while( true ) {
        iVar8 = 0;
        if (0 < iVar1) {
          iVar8 = iVar1;
        }
        if (c.m_size <= iVar4) break;
        lVar7 = lVar9 * 4;
        iVar12 = iVar2;
        for (lVar11 = 0; -iVar8 != (int)lVar11; lVar11 = lVar11 + -1) {
          local_f8._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_f8._M_impl.super__Vector_impl_data._M_start._4_4_,iVar12);
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&gtest_ar,"i*13 - 42*j","all[pos++]",(int *)&local_f8,
                     (int *)((long)all.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar7));
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&local_f8);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar10 = "";
            }
            else {
              pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_100,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_collective.cpp"
                       ,0x158,pcVar10);
            testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
            goto LAB_0014deb5;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          lVar7 = lVar7 + 4;
          iVar12 = iVar12 + -0x2a;
        }
        iVar4 = iVar4 + 1;
        iVar1 = iVar1 + 5;
        lVar9 = lVar9 - lVar11;
        iVar2 = iVar2 + 0xd;
      }
      goto LAB_0014d904;
    }
    testing::Message::Message((Message *)&local_f8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_collective.cpp"
               ,0x154,pcVar10);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
LAB_0014de68:
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f8);
  }
  else {
    local_100.data_._0_4_ = 0;
    local_f8._M_impl.super__Vector_impl_data._M_start =
         (pointer)((long)all.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)all.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)&gtest_ar,"0u","all.size()",(uint *)&local_100,(unsigned_long *)&local_f8
              );
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_f8);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar10 = "";
      }
      else {
        pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_100,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_collective.cpp"
                 ,0x15c,pcVar10);
      testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
      goto LAB_0014de68;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
LAB_0014d904:
    mxx::comm::comm((comm *)&gtest_ar);
    mxx::gatherv<int>((vector<int,_std::allocator<int>_> *)&local_f8,&els,&recv_sizes,0,
                      (comm *)&gtest_ar);
    std::vector<int,_std::allocator<int>_>::_M_move_assign(&all,&local_f8);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_f8);
    mxx::comm::~comm((comm *)&gtest_ar);
    if (c.m_rank == 0) {
      local_f8._M_impl.super__Vector_impl_data._M_start =
           (pointer)((long)all.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)all.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&gtest_ar,"total_size","all.size()",&total_size,
                 (unsigned_long *)&local_f8);
      if (gtest_ar.success_ != false) {
        iVar1 = 10;
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        iVar2 = 0;
        lVar9 = 0;
        iVar4 = 0;
        while( true ) {
          iVar8 = 0;
          if (0 < iVar1) {
            iVar8 = iVar1;
          }
          if (c.m_size <= iVar4) break;
          lVar7 = lVar9 * 4;
          lVar11 = 0;
          iVar12 = iVar2;
LAB_0014dcc4:
          if (-iVar8 != (int)lVar11) {
            local_f8._M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(local_f8._M_impl.super__Vector_impl_data._M_start._4_4_,iVar12);
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&gtest_ar,"i*13 - 42*j","all[pos++]",(int *)&local_f8,
                       (int *)((long)all.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start + lVar7));
            if (gtest_ar.success_ != false) goto code_r0x0014dcfa;
            testing::Message::Message((Message *)&local_f8);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar10 = "";
            }
            else {
              pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_100,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_collective.cpp"
                       ,0x165,pcVar10);
            testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
LAB_0014deb5:
            testing::internal::AssertHelper::~AssertHelper(&local_100);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_f8);
            goto LAB_0014dece;
          }
          iVar4 = iVar4 + 1;
          iVar1 = iVar1 + 5;
          lVar9 = lVar9 - lVar11;
          iVar2 = iVar2 + 0xd;
        }
        goto LAB_0014ded3;
      }
      testing::Message::Message((Message *)&local_f8);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar10 = "";
      }
      else {
        pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_100,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_collective.cpp"
                 ,0x161,pcVar10);
      testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
      goto LAB_0014de68;
    }
    local_100.data_._0_4_ = 0;
    local_f8._M_impl.super__Vector_impl_data._M_start =
         (pointer)((long)all.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)all.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)&gtest_ar,"0u","all.size()",(uint *)&local_100,(unsigned_long *)&local_f8
              );
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_f8);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar10 = "";
      }
      else {
        pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_100,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_collective.cpp"
                 ,0x169,pcVar10);
      testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
      goto LAB_0014de68;
    }
  }
LAB_0014dece:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
LAB_0014ded3:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&all.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&els.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&recv_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  mxx::comm::~comm(&c);
  return;
code_r0x0014dcfa:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  lVar11 = lVar11 + -1;
  lVar7 = lVar7 + 4;
  iVar12 = iVar12 + -0x2a;
  goto LAB_0014dcc4;
}

Assistant:

TEST(MxxColl, GathervGeneral) {
    mxx::comm c;
    std::vector<size_t> recv_sizes;
    // fill elements
    size_t size = 5*(c.rank()+2);
    std::vector<int> els(size);
    for (size_t i = 0; i < size; ++i) {
        els[i] = c.rank()*13 - 42*i;
    }
    std::vector<int> all;
    size_t total_size = 0;
    if (c.rank() == 0) {
        // prepare recv sizes and output vector
        recv_sizes.resize(c.size());
        for (int i = 0; i < c.size(); ++i) {
            recv_sizes[i] = 5*(i+2);
            total_size += recv_sizes[i];
        }
        all.resize(total_size);
    }

    // general gatherv
    mxx::gatherv(&els[0], size, &all[0], recv_sizes, 0, c);
    if (c.rank() == 0) {
        size_t pos = 0;
        for (int i = 0; i < c.size(); ++i) {
            for (int j = 0; j < (5*(i+2)); ++j) {
                ASSERT_EQ(i*13 - 42*j, all[pos++]);
            }
        }
    }
    // convenience functions
    all = mxx::gatherv(&els[0], size, recv_sizes, 0, c);
    if (c.rank() == 0) {
        ASSERT_EQ(total_size, all.size());
        size_t pos = 0;
        for (int i = 0; i < c.size(); ++i) {
            for (int j = 0; j < (5*(i+2)); ++j) {
                ASSERT_EQ(i*13 - 42*j, all[pos++]);
            }
        }
    } else {
        ASSERT_EQ(0u, all.size());
    }
    // convenience functions
    all = mxx::gatherv(els, recv_sizes, 0);
    if (c.rank() == 0) {
        ASSERT_EQ(total_size, all.size());
        size_t pos = 0;
        for (int i = 0; i < c.size(); ++i) {
            for (int j = 0; j < (5*(i+2)); ++j) {
                ASSERT_EQ(i*13 - 42*j, all[pos++]);
            }
        }
    } else {
        ASSERT_EQ(0u, all.size());
    }
}